

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O0

void __thiscall csv::internals::IBasicCSVParser::trim_utf8_bom(IBasicCSVParser *this)

{
  element_type *peVar1;
  size_type sVar2;
  const_reference pvVar3;
  string_view *this_00;
  string_view *data;
  IBasicCSVParser *this_local;
  
  peVar1 = std::
           __shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->data_ptr);
  this_00 = &peVar1->data;
  if ((this->unicode_bom_scan & 1U) == 0) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(this_00);
    if (2 < sVar2) {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](this_00,0);
      if (*pvVar3 == -0x11) {
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](this_00,1);
        if (*pvVar3 == -0x45) {
          pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](this_00,2);
          if (*pvVar3 == -0x41) {
            this->data_pos = this->data_pos + 3;
            this->_utf8_bom = true;
          }
        }
      }
      this->unicode_bom_scan = true;
    }
  }
  return;
}

Assistant:

CSV_INLINE void IBasicCSVParser::trim_utf8_bom() {
            auto& data = this->data_ptr->data;

            if (!this->unicode_bom_scan && data.size() >= 3) {
                if (data[0] == '\xEF' && data[1] == '\xBB' && data[2] == '\xBF') {
                    this->data_pos += 3; // Remove BOM from input string
                    this->_utf8_bom = true;
                }

                this->unicode_bom_scan = true;
            }
        }